

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void fstat_cb(uv_fs_t *req)

{
  undefined8 uVar1;
  ssize_t sVar2;
  int iVar3;
  __uid_t _Var4;
  uv_loop_t *puVar5;
  uv_loop_t *puVar6;
  void *pvVar7;
  uv_file uVar8;
  uv_loop_t *puVar9;
  uv_loop_t *puVar10;
  uv_fs_t *puVar11;
  uv_fs_t *puVar12;
  uv_fs_t *puVar13;
  char *loop;
  uv_fs_t *unaff_R14;
  uv_fs_t *req_00;
  uv_fs_t *puVar14;
  uv_buf_t uVar15;
  uv_fs_t uStackY_ce8;
  uv_loop_t *puStackY_b30;
  code *pcStackY_b28;
  undefined1 auStack_b10 [576];
  uv_loop_t *puStack_8d0;
  uv_loop_t *puStack_770;
  uv_fs_t *puStack_768;
  undefined1 auStack_750 [568];
  void *pvStack_518;
  uint uStack_4f8;
  uv_loop_t *puStack_3b8;
  uv_fs_t uStack_3a8;
  uv_loop_t *puStack_1f0;
  uv_fs_t *puStack_1e8;
  uv_loop_t *puStack_178;
  
  if (req->fs_type == UV_FS_FSTAT) {
    if (req->result != 0) goto LAB_001523a1;
    if (*(long *)((long)req->ptr + 0x38) == 0xd) {
      uv_fs_req_cleanup(req);
      fstat_cb_count = fstat_cb_count + 1;
      return;
    }
  }
  else {
    fstat_cb_cold_1();
LAB_001523a1:
    fstat_cb_cold_2();
  }
  fstat_cb_cold_3();
  req_00 = (uv_fs_t *)&stack0xfffffffffffffe30;
  puVar5 = (uv_loop_t *)&stack0xfffffffffffffe30;
  puVar9 = (uv_loop_t *)0x194395;
  unlink("test_file");
  rmdir("test_dir");
  ::loop = uv_default_loop();
  puVar6 = (uv_loop_t *)0x0;
  iVar3 = uv_fs_access((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe30,"test_file",0,
                       (uv_fs_cb)0x0);
  if (iVar3 < 0) {
    if (-1 < (long)puStack_178) goto LAB_00152614;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe30);
    puVar6 = ::loop;
    iVar3 = uv_fs_access(::loop,(uv_fs_t *)&stack0xfffffffffffffe30,"test_file",0,access_cb);
    puVar9 = (uv_loop_t *)&stack0xfffffffffffffe30;
    if (iVar3 != 0) goto LAB_00152619;
    puVar6 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    puVar9 = (uv_loop_t *)&stack0xfffffffffffffe30;
    if (access_cb_count != 1) goto LAB_0015261e;
    access_cb_count = 0;
    puVar6 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe30,"test_file",0x42,0x180,
                       (uv_fs_cb)0x0);
    puVar10 = puStack_178;
    puVar9 = (uv_loop_t *)&stack0xfffffffffffffe30;
    if (iVar3 < 0) goto LAB_00152623;
    if ((long)puStack_178 < 0) goto LAB_00152628;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe30);
    puVar6 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_access((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe30,"test_file",0,
                         (uv_fs_cb)0x0);
    unaff_R14 = (uv_fs_t *)&stack0xfffffffffffffe30;
    if (iVar3 != 0) goto LAB_0015262d;
    unaff_R14 = (uv_fs_t *)&stack0xfffffffffffffe30;
    if (puStack_178 != (uv_loop_t *)0x0) goto LAB_00152632;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe30);
    puVar6 = ::loop;
    iVar3 = uv_fs_access(::loop,(uv_fs_t *)&stack0xfffffffffffffe30,"test_file",0,access_cb);
    if (iVar3 != 0) goto LAB_00152637;
    puVar6 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    req_00 = (uv_fs_t *)&stack0xfffffffffffffe30;
    if (access_cb_count != 1) goto LAB_0015263c;
    access_cb_count = 0;
    puVar6 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe30,(uv_file)puVar10,
                        (uv_fs_cb)0x0);
    req_00 = (uv_fs_t *)&stack0xfffffffffffffe30;
    if (iVar3 != 0) goto LAB_00152641;
    req_00 = (uv_fs_t *)&stack0xfffffffffffffe30;
    if (puStack_178 != (uv_loop_t *)0x0) goto LAB_00152646;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe30);
    puVar6 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_mkdir((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe30,"test_dir",0x1ff,
                        (uv_fs_cb)0x0);
    puVar10 = (uv_loop_t *)&stack0xfffffffffffffe30;
    req_00 = (uv_fs_t *)&stack0xfffffffffffffe30;
    if (iVar3 != 0) goto LAB_0015264b;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe30);
    puVar6 = (uv_loop_t *)0x0;
    iVar3 = uv_fs_access((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe30,"test_dir",2,
                         (uv_fs_cb)0x0);
    req_00 = (uv_fs_t *)&stack0xfffffffffffffe30;
    if (iVar3 != 0) goto LAB_00152650;
    puVar5 = (uv_loop_t *)&stack0xfffffffffffffe30;
    req_00 = (uv_fs_t *)&stack0xfffffffffffffe30;
    if (puStack_178 != (uv_loop_t *)0x0) goto LAB_00152655;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe30);
    uv_run(::loop,UV_RUN_DEFAULT);
    unlink("test_file");
    rmdir("test_dir");
    puVar5 = uv_default_loop();
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    uv_run(puVar5,UV_RUN_DEFAULT);
    puVar6 = uv_default_loop();
    iVar3 = uv_loop_close(puVar6);
    req_00 = (uv_fs_t *)&stack0xfffffffffffffe30;
    if (iVar3 == 0) {
      return;
    }
  }
  else {
    run_test_fs_access_cold_1();
LAB_00152614:
    run_test_fs_access_cold_2();
LAB_00152619:
    run_test_fs_access_cold_3();
LAB_0015261e:
    run_test_fs_access_cold_4();
LAB_00152623:
    puVar10 = puVar9;
    run_test_fs_access_cold_5();
LAB_00152628:
    run_test_fs_access_cold_6();
LAB_0015262d:
    run_test_fs_access_cold_7();
LAB_00152632:
    req_00 = unaff_R14;
    run_test_fs_access_cold_8();
LAB_00152637:
    run_test_fs_access_cold_9();
LAB_0015263c:
    run_test_fs_access_cold_10();
LAB_00152641:
    run_test_fs_access_cold_11();
LAB_00152646:
    run_test_fs_access_cold_12();
LAB_0015264b:
    puVar5 = puVar10;
    run_test_fs_access_cold_13();
LAB_00152650:
    run_test_fs_access_cold_14();
LAB_00152655:
    run_test_fs_access_cold_15();
  }
  run_test_fs_access_cold_16();
  if (puVar6->backend_fd == 0xc) {
    access_cb_count = access_cb_count + 1;
    uv_fs_req_cleanup((uv_fs_t *)puVar6);
    return;
  }
  access_cb_cold_1();
  puVar9 = (uv_loop_t *)0x194395;
  puStack_3b8 = (uv_loop_t *)0x152691;
  puStack_1f0 = puVar5;
  puStack_1e8 = req_00;
  unlink("test_file");
  puStack_3b8 = (uv_loop_t *)0x152696;
  ::loop = uv_default_loop();
  puVar12 = &uStack_3a8;
  puVar5 = (uv_loop_t *)0x0;
  puStack_3b8 = (uv_loop_t *)0x1526ba;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,puVar12,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  sVar2 = uStack_3a8.result;
  if (iVar3 < 0) {
    puStack_3b8 = (uv_loop_t *)0x15298d;
    run_test_fs_chmod_cold_1();
LAB_0015298d:
    puStack_3b8 = (uv_loop_t *)0x152992;
    run_test_fs_chmod_cold_2();
LAB_00152992:
    puStack_3b8 = (uv_loop_t *)0x152997;
    run_test_fs_chmod_cold_3();
LAB_00152997:
    puStack_3b8 = (uv_loop_t *)0x15299c;
    run_test_fs_chmod_cold_4();
LAB_0015299c:
    puStack_3b8 = (uv_loop_t *)0x1529a1;
    run_test_fs_chmod_cold_5();
LAB_001529a1:
    puStack_3b8 = (uv_loop_t *)0x1529a6;
    run_test_fs_chmod_cold_6();
LAB_001529a6:
    puStack_3b8 = (uv_loop_t *)0x1529ab;
    run_test_fs_chmod_cold_7();
LAB_001529ab:
    puStack_3b8 = (uv_loop_t *)0x1529b0;
    run_test_fs_chmod_cold_8();
LAB_001529b0:
    puStack_3b8 = (uv_loop_t *)0x1529b5;
    run_test_fs_chmod_cold_9();
LAB_001529b5:
    puStack_3b8 = (uv_loop_t *)0x1529ba;
    run_test_fs_chmod_cold_10();
LAB_001529ba:
    puStack_3b8 = (uv_loop_t *)0x1529bf;
    run_test_fs_chmod_cold_11();
LAB_001529bf:
    puStack_3b8 = (uv_loop_t *)0x1529c4;
    run_test_fs_chmod_cold_12();
LAB_001529c4:
    puStack_3b8 = (uv_loop_t *)0x1529c9;
    run_test_fs_chmod_cold_13();
LAB_001529c9:
    puStack_3b8 = (uv_loop_t *)0x1529ce;
    run_test_fs_chmod_cold_14();
LAB_001529ce:
    puStack_3b8 = (uv_loop_t *)0x1529d3;
    run_test_fs_chmod_cold_15();
LAB_001529d3:
    puStack_3b8 = (uv_loop_t *)0x1529d8;
    run_test_fs_chmod_cold_16();
  }
  else {
    puVar9 = (uv_loop_t *)uStack_3a8.result;
    if (uStack_3a8.result < 0) goto LAB_0015298d;
    req_00 = &uStack_3a8;
    puStack_3b8 = (uv_loop_t *)0x1526dd;
    uv_fs_req_cleanup(req_00);
    puStack_3b8 = (uv_loop_t *)0x1526ee;
    iov = uv_buf_init(test_buf,0xd);
    puVar5 = (uv_loop_t *)0x0;
    uVar8 = (uv_file)sVar2;
    puStack_3b8 = (uv_loop_t *)0x152724;
    puVar12 = req_00;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,req_00,uVar8,&iov,1,-1,(uv_fs_cb)0x0);
    puVar9 = (uv_loop_t *)sVar2;
    if (iVar3 != 0xd) goto LAB_00152992;
    if ((uv_loop_t *)uStack_3a8.result != (uv_loop_t *)0xd) goto LAB_00152997;
    req_00 = &uStack_3a8;
    puStack_3b8 = (uv_loop_t *)0x152746;
    uv_fs_req_cleanup(req_00);
    puVar5 = (uv_loop_t *)0x0;
    puStack_3b8 = (uv_loop_t *)0x15275f;
    puVar12 = req_00;
    iVar3 = uv_fs_chmod((uv_loop_t *)0x0,req_00,"test_file",0x80,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_0015299c;
    if ((uv_loop_t *)uStack_3a8.result != (uv_loop_t *)0x0) goto LAB_001529a1;
    req_00 = &uStack_3a8;
    puStack_3b8 = (uv_loop_t *)0x152780;
    uv_fs_req_cleanup(req_00);
    puStack_3b8 = (uv_loop_t *)0x152794;
    check_permission("test_file",0x80);
    puVar5 = (uv_loop_t *)0x0;
    puStack_3b8 = (uv_loop_t *)0x1527a9;
    puVar12 = req_00;
    iVar3 = uv_fs_chmod((uv_loop_t *)0x0,req_00,"test_file",0x100,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_001529a6;
    if ((uv_loop_t *)uStack_3a8.result != (uv_loop_t *)0x0) goto LAB_001529ab;
    req_00 = &uStack_3a8;
    puStack_3b8 = (uv_loop_t *)0x1527ca;
    uv_fs_req_cleanup(req_00);
    puStack_3b8 = (uv_loop_t *)0x1527db;
    check_permission("test_file",0x100);
    puVar5 = (uv_loop_t *)0x0;
    puStack_3b8 = (uv_loop_t *)0x1527ef;
    puVar12 = req_00;
    iVar3 = uv_fs_fchmod((uv_loop_t *)0x0,req_00,uVar8,0x180,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_001529b0;
    if ((uv_loop_t *)uStack_3a8.result != (uv_loop_t *)0x0) goto LAB_001529b5;
    req_00 = &uStack_3a8;
    puStack_3b8 = (uv_loop_t *)0x152810;
    uv_fs_req_cleanup(req_00);
    puStack_3b8 = (uv_loop_t *)0x152824;
    check_permission("test_file",0x180);
    uStack_3a8.data = &run_test_fs_chmod::mode;
    puStack_3b8 = (uv_loop_t *)0x15284c;
    puVar12 = req_00;
    puVar5 = ::loop;
    iVar3 = uv_fs_chmod(::loop,req_00,"test_file",0x80,chmod_cb);
    if (iVar3 != 0) goto LAB_001529ba;
    puVar12 = (uv_fs_t *)0x0;
    puStack_3b8 = (uv_loop_t *)0x152862;
    puVar5 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (chmod_cb_count != 1) goto LAB_001529bf;
    chmod_cb_count = 0;
    puVar12 = &uStack_3a8;
    uStack_3a8.data = &run_test_fs_chmod::mode_1;
    puStack_3b8 = (uv_loop_t *)0x1528a7;
    puVar5 = ::loop;
    iVar3 = uv_fs_chmod(::loop,puVar12,"test_file",0x100,chmod_cb);
    if (iVar3 != 0) goto LAB_001529c4;
    puVar12 = (uv_fs_t *)0x0;
    puStack_3b8 = (uv_loop_t *)0x1528bd;
    puVar5 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (chmod_cb_count != 1) goto LAB_001529c9;
    puVar12 = &uStack_3a8;
    uStack_3a8.data = &run_test_fs_chmod::mode_2;
    puStack_3b8 = (uv_loop_t *)0x1528f3;
    puVar5 = ::loop;
    iVar3 = uv_fs_fchmod(::loop,puVar12,uVar8,0x180,fchmod_cb);
    if (iVar3 != 0) goto LAB_001529ce;
    puVar12 = (uv_fs_t *)0x0;
    puStack_3b8 = (uv_loop_t *)0x152909;
    puVar5 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (fchmod_cb_count != 1) goto LAB_001529d3;
    puStack_3b8 = (uv_loop_t *)0x15292b;
    uv_fs_close(::loop,&uStack_3a8,uVar8,(uv_fs_cb)0x0);
    puStack_3b8 = (uv_loop_t *)0x152939;
    uv_run(::loop,UV_RUN_DEFAULT);
    puStack_3b8 = (uv_loop_t *)0x152945;
    unlink("test_file");
    puStack_3b8 = (uv_loop_t *)0x15294a;
    puVar9 = uv_default_loop();
    puStack_3b8 = (uv_loop_t *)0x15295e;
    uv_walk(puVar9,close_walk_cb,(void *)0x0);
    puVar12 = (uv_fs_t *)0x0;
    puStack_3b8 = (uv_loop_t *)0x152968;
    uv_run(puVar9,UV_RUN_DEFAULT);
    puStack_3b8 = (uv_loop_t *)0x15296d;
    puVar5 = uv_default_loop();
    puStack_3b8 = (uv_loop_t *)0x152975;
    iVar3 = uv_loop_close(puVar5);
    if (iVar3 == 0) {
      return;
    }
  }
  puStack_3b8 = (uv_loop_t *)check_permission;
  run_test_fs_chmod_cold_17();
  puVar11 = (uv_fs_t *)((ulong)puVar12 & 0xffffffff);
  puVar13 = (uv_fs_t *)0x0;
  auStack_750._464_8_ = (void *)0x1529f8;
  puStack_3b8 = puVar9;
  iVar3 = uv_fs_stat((uv_loop_t *)0x0,(uv_fs_t *)(auStack_750 + 0x1e0),(char *)puVar5,(uv_fs_cb)0x0)
  ;
  if (iVar3 == 0) {
    if (pvStack_518 != (void *)0x0) goto LAB_00152a2c;
    if ((uStack_4f8 & 0x1ff) == (uint)puVar12) {
      auStack_750._464_8_ = (void *)0x152a1e;
      uv_fs_req_cleanup((uv_fs_t *)(auStack_750 + 0x1e0));
      return;
    }
  }
  else {
    auStack_750._464_8_ = (void *)0x152a2c;
    check_permission_cold_1();
LAB_00152a2c:
    auStack_750._464_8_ = (void *)0x152a31;
    check_permission_cold_2();
  }
  auStack_750._464_8_ = chmod_cb;
  check_permission_cold_3();
  auStack_750._464_8_ = puVar11;
  if (puVar13->fs_type == UV_FS_CHMOD) {
    puVar11 = puVar13;
    if (puVar13->result == 0) {
      chmod_cb_count = chmod_cb_count + 1;
      auStack_750._456_8_ = (uv__io_cb)0x152a55;
      uv_fs_req_cleanup(puVar13);
      check_permission("test_file",*puVar13->data);
      return;
    }
  }
  else {
    auStack_750._456_8_ = (uv__io_cb)0x152a6c;
    chmod_cb_cold_1();
  }
  auStack_750._456_8_ = fchmod_cb;
  chmod_cb_cold_2();
  auStack_750._456_8_ = puVar11;
  if (puVar13->fs_type == UV_FS_FCHMOD) {
    auStack_750._440_8_ = puVar13;
    if (puVar13->result == 0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      auStack_750._448_8_ = (_func_void *)0x152a90;
      uv_fs_req_cleanup(puVar13);
      check_permission("test_file",*puVar13->data);
      return;
    }
  }
  else {
    auStack_750._448_8_ = (_func_void *)0x152aa7;
    fchmod_cb_cold_1();
    auStack_750._440_8_ = puVar11;
  }
  auStack_750._448_8_ = run_test_fs_unlink_readonly;
  fchmod_cb_cold_2();
  puVar5 = (uv_loop_t *)0x194395;
  puStack_768 = (uv_fs_t *)0x152ac5;
  auStack_750._448_8_ = req_00;
  unlink("test_file");
  puStack_768 = (uv_fs_t *)0x152aca;
  ::loop = uv_default_loop();
  puStack_768 = (uv_fs_t *)0x152aee;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_750,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  uVar1 = auStack_750._88_8_;
  if (iVar3 < 0) {
    puStack_768 = (uv_fs_t *)0x152c8b;
    run_test_fs_unlink_readonly_cold_1();
LAB_00152c8b:
    puStack_768 = (uv_fs_t *)0x152c90;
    run_test_fs_unlink_readonly_cold_2();
LAB_00152c90:
    puStack_768 = (uv_fs_t *)0x152c95;
    run_test_fs_unlink_readonly_cold_3();
LAB_00152c95:
    puStack_768 = (uv_fs_t *)0x152c9a;
    run_test_fs_unlink_readonly_cold_4();
LAB_00152c9a:
    puStack_768 = (uv_fs_t *)0x152c9f;
    run_test_fs_unlink_readonly_cold_5();
LAB_00152c9f:
    puStack_768 = (uv_fs_t *)0x152ca4;
    run_test_fs_unlink_readonly_cold_6();
LAB_00152ca4:
    puStack_768 = (uv_fs_t *)0x152ca9;
    run_test_fs_unlink_readonly_cold_7();
LAB_00152ca9:
    puStack_768 = (uv_fs_t *)0x152cae;
    run_test_fs_unlink_readonly_cold_8();
  }
  else {
    puVar5 = (uv_loop_t *)auStack_750._88_8_;
    if ((long)auStack_750._88_8_ < 0) goto LAB_00152c8b;
    req_00 = (uv_fs_t *)auStack_750;
    puStack_768 = (uv_fs_t *)0x152b11;
    uv_fs_req_cleanup(req_00);
    puStack_768 = (uv_fs_t *)0x152b22;
    uVar15 = uv_buf_init(test_buf,0xd);
    puStack_768 = (uv_fs_t *)0x152b58;
    iov = uVar15;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,req_00,(uv_file)uVar1,&iov,1,-1,(uv_fs_cb)0x0);
    puVar5 = (uv_loop_t *)uVar1;
    if (iVar3 != 0xd) goto LAB_00152c90;
    if ((uv_loop_t *)auStack_750._88_8_ != (uv_loop_t *)0xd) goto LAB_00152c95;
    req_00 = (uv_fs_t *)auStack_750;
    puStack_768 = (uv_fs_t *)0x152b7a;
    uv_fs_req_cleanup(req_00);
    puStack_768 = (uv_fs_t *)0x152b8d;
    uv_fs_close(::loop,req_00,(uv_file)uVar1,(uv_fs_cb)0x0);
    puStack_768 = (uv_fs_t *)0x152ba6;
    iVar3 = uv_fs_chmod((uv_loop_t *)0x0,req_00,"test_file",0x100,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00152c9a;
    if ((uv_loop_t *)auStack_750._88_8_ != (uv_loop_t *)0x0) goto LAB_00152c9f;
    puVar5 = (uv_loop_t *)auStack_750;
    puStack_768 = (uv_fs_t *)0x152bc7;
    uv_fs_req_cleanup((uv_fs_t *)puVar5);
    req_00 = (uv_fs_t *)0x194395;
    puStack_768 = (uv_fs_t *)0x152bdb;
    check_permission("test_file",0x100);
    puStack_768 = (uv_fs_t *)0x152bea;
    iVar3 = uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)puVar5,"test_file",(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00152ca4;
    if ((uv_loop_t *)auStack_750._88_8_ != (uv_loop_t *)0x0) goto LAB_00152ca9;
    puStack_768 = (uv_fs_t *)0x152c0b;
    uv_fs_req_cleanup((uv_fs_t *)auStack_750);
    puStack_768 = (uv_fs_t *)0x152c19;
    uv_run(::loop,UV_RUN_DEFAULT);
    req_00 = (uv_fs_t *)0x194395;
    puStack_768 = (uv_fs_t *)0x152c35;
    uv_fs_chmod((uv_loop_t *)0x0,(uv_fs_t *)auStack_750,"test_file",0x180,(uv_fs_cb)0x0);
    puStack_768 = (uv_fs_t *)0x152c3d;
    uv_fs_req_cleanup((uv_fs_t *)auStack_750);
    puStack_768 = (uv_fs_t *)0x152c45;
    unlink("test_file");
    puStack_768 = (uv_fs_t *)0x152c4a;
    puVar5 = uv_default_loop();
    puStack_768 = (uv_fs_t *)0x152c5e;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puStack_768 = (uv_fs_t *)0x152c68;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_768 = (uv_fs_t *)0x152c6d;
    puVar9 = uv_default_loop();
    puStack_768 = (uv_fs_t *)0x152c75;
    iVar3 = uv_loop_close(puVar9);
    if (iVar3 == 0) {
      return;
    }
  }
  puStack_768 = (uv_fs_t *)run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_9();
  puVar14 = (uv_fs_t *)(auStack_b10 + 0x1e8);
  puVar13 = (uv_fs_t *)(auStack_b10 + 0x1e8);
  puVar11 = (uv_fs_t *)(auStack_b10 + 0x1e8);
  puVar12 = (uv_fs_t *)(auStack_b10 + 0x1e8);
  puVar9 = (uv_loop_t *)0x194395;
  auStack_b10._480_8_ = (void *)0x152ccc;
  puStack_770 = puVar5;
  puStack_768 = req_00;
  unlink("test_file");
  auStack_b10._480_8_ = (void *)0x152cd8;
  unlink("test_file_link");
  auStack_b10._480_8_ = (void *)0x152cdd;
  ::loop = uv_default_loop();
  puVar6 = (uv_loop_t *)0x0;
  auStack_b10._480_8_ = (void *)0x152cff;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)(auStack_b10 + 0x1e8),"test_file",0x42,0x180,
                     (uv_fs_cb)0x0);
  puVar5 = puStack_8d0;
  if (iVar3 < 0) {
    auStack_b10._480_8_ = (void *)0x152fd0;
    run_test_fs_chown_cold_1();
LAB_00152fd0:
    auStack_b10._480_8_ = (void *)0x152fd5;
    run_test_fs_chown_cold_2();
LAB_00152fd5:
    auStack_b10._480_8_ = (void *)0x152fda;
    run_test_fs_chown_cold_3();
LAB_00152fda:
    puVar14 = req_00;
    auStack_b10._480_8_ = (void *)0x152fdf;
    run_test_fs_chown_cold_4();
LAB_00152fdf:
    auStack_b10._480_8_ = (void *)0x152fe4;
    run_test_fs_chown_cold_5();
LAB_00152fe4:
    puVar13 = puVar14;
    auStack_b10._480_8_ = (void *)0x152fe9;
    run_test_fs_chown_cold_6();
LAB_00152fe9:
    auStack_b10._480_8_ = (void *)0x152fee;
    run_test_fs_chown_cold_7();
LAB_00152fee:
    auStack_b10._480_8_ = (void *)0x152ff3;
    run_test_fs_chown_cold_8();
LAB_00152ff3:
    auStack_b10._480_8_ = (void *)0x152ff8;
    run_test_fs_chown_cold_9();
LAB_00152ff8:
    auStack_b10._480_8_ = (void *)0x152ffd;
    run_test_fs_chown_cold_10();
LAB_00152ffd:
    auStack_b10._480_8_ = (void *)0x153002;
    run_test_fs_chown_cold_11();
LAB_00153002:
    auStack_b10._480_8_ = (void *)0x153007;
    run_test_fs_chown_cold_12();
LAB_00153007:
    auStack_b10._480_8_ = (void *)0x15300c;
    run_test_fs_chown_cold_13();
LAB_0015300c:
    puVar11 = puVar13;
    auStack_b10._480_8_ = (void *)0x153011;
    run_test_fs_chown_cold_14();
LAB_00153011:
    auStack_b10._480_8_ = (void *)0x153016;
    run_test_fs_chown_cold_15();
LAB_00153016:
    puVar12 = puVar11;
    auStack_b10._480_8_ = (void *)0x15301b;
    run_test_fs_chown_cold_16();
LAB_0015301b:
    auStack_b10._480_8_ = (void *)0x153020;
    run_test_fs_chown_cold_17();
LAB_00153020:
    auStack_b10._480_8_ = (void *)0x153025;
    run_test_fs_chown_cold_18();
LAB_00153025:
    auStack_b10._480_8_ = (void *)0x15302a;
    run_test_fs_chown_cold_19();
LAB_0015302a:
    auStack_b10._480_8_ = (void *)0x15302f;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar9 = puStack_8d0;
    if ((long)puStack_8d0 < 0) goto LAB_00152fd0;
    auStack_b10._480_8_ = (void *)0x152d20;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_b10 + 0x1e8));
    puVar6 = (uv_loop_t *)0x0;
    auStack_b10._480_8_ = (void *)0x152d3f;
    iVar3 = uv_fs_chown((uv_loop_t *)0x0,(uv_fs_t *)(auStack_b10 + 0x1e8),"test_file",0xffffffff,
                        0xffffffff,(uv_fs_cb)0x0);
    puVar9 = puVar5;
    req_00 = (uv_fs_t *)(auStack_b10 + 0x1e8);
    if (iVar3 != 0) goto LAB_00152fd5;
    req_00 = (uv_fs_t *)(auStack_b10 + 0x1e8);
    if (puStack_8d0 != (uv_loop_t *)0x0) goto LAB_00152fda;
    auStack_b10._480_8_ = (void *)0x152d5e;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_b10 + 0x1e8));
    puVar6 = (uv_loop_t *)0x0;
    uVar8 = (uv_file)puVar5;
    auStack_b10._480_8_ = (void *)0x152d78;
    iVar3 = uv_fs_fchown((uv_loop_t *)0x0,(uv_fs_t *)(auStack_b10 + 0x1e8),uVar8,0xffffffff,
                         0xffffffff,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00152fdf;
    puVar14 = (uv_fs_t *)(auStack_b10 + 0x1e8);
    if (puStack_8d0 != (uv_loop_t *)0x0) goto LAB_00152fe4;
    auStack_b10._480_8_ = (void *)0x152d97;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_b10 + 0x1e8));
    auStack_b10._480_8_ = (void *)0x152dbf;
    puVar6 = ::loop;
    iVar3 = uv_fs_chown(::loop,(uv_fs_t *)(auStack_b10 + 0x1e8),"test_file",0xffffffff,0xffffffff,
                        chown_cb);
    if (iVar3 != 0) goto LAB_00152fe9;
    auStack_b10._480_8_ = (void *)0x152dd5;
    puVar6 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    puVar13 = (uv_fs_t *)(auStack_b10 + 0x1e8);
    if (chown_cb_count != 1) goto LAB_00152fee;
    chown_cb_count = 0;
    auStack_b10._480_8_ = (void *)0x152e0e;
    puVar6 = ::loop;
    iVar3 = uv_fs_chown(::loop,(uv_fs_t *)(auStack_b10 + 0x1e8),"test_file",0,0,chown_root_cb);
    puVar13 = (uv_fs_t *)(auStack_b10 + 0x1e8);
    if (iVar3 != 0) goto LAB_00152ff3;
    auStack_b10._480_8_ = (void *)0x152e24;
    puVar6 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    puVar13 = (uv_fs_t *)(auStack_b10 + 0x1e8);
    if (chown_cb_count != 1) goto LAB_00152ff8;
    auStack_b10._480_8_ = (void *)0x152e54;
    puVar6 = ::loop;
    iVar3 = uv_fs_fchown(::loop,(uv_fs_t *)(auStack_b10 + 0x1e8),uVar8,0xffffffff,0xffffffff,
                         fchown_cb);
    puVar13 = (uv_fs_t *)(auStack_b10 + 0x1e8);
    if (iVar3 != 0) goto LAB_00152ffd;
    auStack_b10._480_8_ = (void *)0x152e6a;
    puVar6 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    puVar13 = (uv_fs_t *)(auStack_b10 + 0x1e8);
    if (fchown_cb_count != 1) goto LAB_00153002;
    puVar6 = (uv_loop_t *)0x0;
    auStack_b10._480_8_ = (void *)0x152e92;
    iVar3 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)(auStack_b10 + 0x1e8),"test_file",
                       "test_file_link",(uv_fs_cb)0x0);
    puVar13 = (uv_fs_t *)(auStack_b10 + 0x1e8);
    if (iVar3 != 0) goto LAB_00153007;
    puVar13 = (uv_fs_t *)(auStack_b10 + 0x1e8);
    if (puStack_8d0 != (uv_loop_t *)0x0) goto LAB_0015300c;
    auStack_b10._480_8_ = (void *)0x152eb1;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_b10 + 0x1e8));
    puVar6 = (uv_loop_t *)0x0;
    auStack_b10._480_8_ = (void *)0x152ed0;
    iVar3 = uv_fs_lchown((uv_loop_t *)0x0,(uv_fs_t *)(auStack_b10 + 0x1e8),"test_file_link",
                         0xffffffff,0xffffffff,(uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00153011;
    puVar11 = (uv_fs_t *)(auStack_b10 + 0x1e8);
    if (puStack_8d0 != (uv_loop_t *)0x0) goto LAB_00153016;
    auStack_b10._480_8_ = (void *)0x152eef;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_b10 + 0x1e8));
    auStack_b10._480_8_ = (void *)0x152f17;
    puVar6 = ::loop;
    iVar3 = uv_fs_lchown(::loop,(uv_fs_t *)(auStack_b10 + 0x1e8),"test_file_link",0xffffffff,
                         0xffffffff,lchown_cb);
    if (iVar3 != 0) goto LAB_0015301b;
    auStack_b10._480_8_ = (void *)0x152f2d;
    puVar6 = ::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    puVar12 = (uv_fs_t *)(auStack_b10 + 0x1e8);
    if (lchown_cb_count != 1) goto LAB_00153020;
    puVar6 = (uv_loop_t *)0x0;
    auStack_b10._480_8_ = (void *)0x152f48;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)(auStack_b10 + 0x1e8),uVar8,(uv_fs_cb)0x0);
    puVar12 = (uv_fs_t *)(auStack_b10 + 0x1e8);
    if (iVar3 != 0) goto LAB_00153025;
    puVar12 = (uv_fs_t *)(auStack_b10 + 0x1e8);
    if (puStack_8d0 != (uv_loop_t *)0x0) goto LAB_0015302a;
    auStack_b10._480_8_ = (void *)0x152f64;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_b10 + 0x1e8));
    auStack_b10._480_8_ = (void *)0x152f72;
    uv_run(::loop,UV_RUN_DEFAULT);
    auStack_b10._480_8_ = (void *)0x152f7e;
    unlink("test_file");
    auStack_b10._480_8_ = (void *)0x152f8a;
    unlink("test_file_link");
    auStack_b10._480_8_ = (void *)0x152f8f;
    puVar9 = uv_default_loop();
    auStack_b10._480_8_ = (void *)0x152fa3;
    uv_walk(puVar9,close_walk_cb,(void *)0x0);
    auStack_b10._480_8_ = (void *)0x152fad;
    uv_run(puVar9,UV_RUN_DEFAULT);
    auStack_b10._480_8_ = (void *)0x152fb2;
    puVar6 = uv_default_loop();
    auStack_b10._480_8_ = (void *)0x152fba;
    iVar3 = uv_loop_close(puVar6);
    puVar12 = (uv_fs_t *)(auStack_b10 + 0x1e8);
    if (iVar3 == 0) {
      return;
    }
  }
  auStack_b10._480_8_ = chown_cb;
  run_test_fs_chown_cold_21();
  if (puVar6->backend_fd == 0x1a) {
    if (puVar6->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar6);
      return;
    }
  }
  else {
    auStack_b10._472_8_ = (void *)0x153053;
    chown_cb_cold_1();
  }
  auStack_b10._472_8_ = chown_root_cb;
  chown_cb_cold_2();
  auStack_b10._472_8_ = puVar9;
  if (puVar6->backend_fd == 0x1a) {
    auStack_b10._464_8_ = (void *)0x153067;
    puVar5 = puVar6;
    _Var4 = geteuid();
    pvVar7 = puVar6->watcher_queue[0];
    if (_Var4 != 0) {
      if (pvVar7 == (void *)0xffffffffffffffff) goto LAB_0015307f;
      auStack_b10._464_8_ = (void *)0x15307a;
      chown_root_cb_cold_2();
    }
    puVar9 = puVar6;
    if (pvVar7 == (void *)0x0) {
LAB_0015307f:
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar6);
      return;
    }
  }
  else {
    auStack_b10._464_8_ = (void *)0x153093;
    chown_root_cb_cold_1();
    puVar5 = puVar6;
  }
  auStack_b10._464_8_ = fchown_cb;
  chown_root_cb_cold_3();
  if (puVar5->backend_fd == 0x1b) {
    if (puVar5->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar5);
      return;
    }
  }
  else {
    auStack_b10._456_8_ = (uv__io_cb)0x1530b7;
    fchown_cb_cold_1();
  }
  auStack_b10._456_8_ = lchown_cb;
  fchown_cb_cold_2();
  if (puVar5->backend_fd == 0x1e) {
    if (puVar5->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)puVar5);
      return;
    }
  }
  else {
    auStack_b10._448_8_ = (_func_void *)0x1530db;
    lchown_cb_cold_1();
  }
  auStack_b10._448_8_ = run_test_fs_link;
  lchown_cb_cold_2();
  puVar5 = (uv_loop_t *)0x194395;
  pcStackY_b28 = (code *)0x1530f9;
  auStack_b10._440_8_ = puVar9;
  auStack_b10._448_8_ = puVar12;
  unlink("test_file");
  pcStackY_b28 = (code *)0x153105;
  unlink("test_file_link");
  pcStackY_b28 = (code *)0x153111;
  unlink("test_file_link2");
  pcStackY_b28 = (code *)0x153116;
  ::loop = uv_default_loop();
  loop = (char *)0x0;
  pcStackY_b28 = (code *)0x15313a;
  iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_b10,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  uVar1 = auStack_b10._88_8_;
  if (iVar3 < 0) {
    pcStackY_b28 = (code *)0x153478;
    run_test_fs_link_cold_1();
LAB_00153478:
    pcStackY_b28 = (code *)0x15347d;
    run_test_fs_link_cold_2();
LAB_0015347d:
    pcStackY_b28 = (code *)0x153482;
    run_test_fs_link_cold_3();
LAB_00153482:
    pcStackY_b28 = (code *)0x153487;
    run_test_fs_link_cold_4();
LAB_00153487:
    pcStackY_b28 = (code *)0x15348c;
    run_test_fs_link_cold_5();
LAB_0015348c:
    pcStackY_b28 = (code *)0x153491;
    run_test_fs_link_cold_6();
LAB_00153491:
    puVar9 = puVar5;
    pcStackY_b28 = (code *)0x153496;
    run_test_fs_link_cold_7();
LAB_00153496:
    pcStackY_b28 = (code *)0x15349b;
    run_test_fs_link_cold_8();
LAB_0015349b:
    pcStackY_b28 = (code *)0x1534a0;
    run_test_fs_link_cold_9();
LAB_001534a0:
    pcStackY_b28 = (code *)0x1534a5;
    run_test_fs_link_cold_10();
LAB_001534a5:
    pcStackY_b28 = (code *)0x1534aa;
    run_test_fs_link_cold_11();
LAB_001534aa:
    pcStackY_b28 = (code *)0x1534af;
    run_test_fs_link_cold_12();
LAB_001534af:
    pcStackY_b28 = (code *)0x1534b4;
    run_test_fs_link_cold_13();
LAB_001534b4:
    puVar5 = puVar9;
    pcStackY_b28 = (code *)0x1534b9;
    run_test_fs_link_cold_14();
LAB_001534b9:
    pcStackY_b28 = (code *)0x1534be;
    run_test_fs_link_cold_15();
LAB_001534be:
    pcStackY_b28 = (code *)0x1534c3;
    run_test_fs_link_cold_16();
LAB_001534c3:
    pcStackY_b28 = (code *)0x1534c8;
    run_test_fs_link_cold_17();
LAB_001534c8:
    pcStackY_b28 = (code *)0x1534cd;
    run_test_fs_link_cold_18();
  }
  else {
    puVar5 = (uv_loop_t *)auStack_b10._88_8_;
    if ((long)auStack_b10._88_8_ < 0) goto LAB_00153478;
    pcStackY_b28 = (code *)0x15315d;
    uv_fs_req_cleanup((uv_fs_t *)auStack_b10);
    pcStackY_b28 = (code *)0x15316e;
    uVar15 = uv_buf_init(test_buf,0xd);
    loop = (char *)0x0;
    pcStackY_b28 = (code *)0x1531a4;
    iov = uVar15;
    iVar3 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)auStack_b10,(uv_file)uVar1,&iov,1,-1,
                        (uv_fs_cb)0x0);
    puVar5 = (uv_loop_t *)uVar1;
    if (iVar3 != 0xd) goto LAB_0015347d;
    if ((uv_loop_t *)auStack_b10._88_8_ != (uv_loop_t *)0xd) goto LAB_00153482;
    pcStackY_b28 = (code *)0x1531c6;
    uv_fs_req_cleanup((uv_fs_t *)auStack_b10);
    pcStackY_b28 = (code *)0x1531d9;
    uv_fs_close(::loop,(uv_fs_t *)auStack_b10,(uv_file)uVar1,(uv_fs_cb)0x0);
    loop = (char *)0x0;
    pcStackY_b28 = (code *)0x1531f4;
    iVar3 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)auStack_b10,"test_file","test_file_link",
                       (uv_fs_cb)0x0);
    if (iVar3 != 0) goto LAB_00153487;
    if ((uv_loop_t *)auStack_b10._88_8_ != (uv_loop_t *)0x0) goto LAB_0015348c;
    pcStackY_b28 = (code *)0x153215;
    uv_fs_req_cleanup((uv_fs_t *)auStack_b10);
    loop = (char *)0x0;
    pcStackY_b28 = (code *)0x153231;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_b10,"test_file_link",2,0,(uv_fs_cb)0x0);
    puVar9 = (uv_loop_t *)auStack_b10._88_8_;
    puVar5 = (uv_loop_t *)auStack_b10;
    if (iVar3 < 0) goto LAB_00153491;
    if ((long)auStack_b10._88_8_ < 0) goto LAB_00153496;
    pcStackY_b28 = (code *)0x153254;
    uv_fs_req_cleanup((uv_fs_t *)auStack_b10);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_b28 = (code *)0x153276;
    uVar15 = uv_buf_init(buf,0x20);
    loop = (char *)0x0;
    pcStackY_b28 = (code *)0x1532a8;
    iov = uVar15;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)auStack_b10,(uv_file)puVar9,&iov,1,0,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_0015349b;
    if ((long)auStack_b10._88_8_ < 0) goto LAB_001534a0;
    loop = buf;
    pcStackY_b28 = (code *)0x1532cf;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_001534a5;
    pcStackY_b28 = (code *)0x1532de;
    close((uv_file)puVar9);
    pcStackY_b28 = (code *)0x153304;
    loop = (char *)::loop;
    iVar3 = uv_fs_link(::loop,(uv_fs_t *)auStack_b10,"test_file","test_file_link2",link_cb);
    if (iVar3 != 0) goto LAB_001534aa;
    pcStackY_b28 = (code *)0x15331a;
    loop = (char *)::loop;
    uv_run(::loop,UV_RUN_DEFAULT);
    if (link_cb_count != 1) goto LAB_001534af;
    loop = (char *)0x0;
    pcStackY_b28 = (code *)0x153345;
    iVar3 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)auStack_b10,"test_file_link2",2,0,(uv_fs_cb)0x0);
    puVar5 = (uv_loop_t *)auStack_b10._88_8_;
    if (iVar3 < 0) goto LAB_001534b4;
    if ((long)auStack_b10._88_8_ < 0) goto LAB_001534b9;
    pcStackY_b28 = (code *)0x153368;
    uv_fs_req_cleanup((uv_fs_t *)auStack_b10);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStackY_b28 = (code *)0x15338a;
    uVar15 = uv_buf_init(buf,0x20);
    loop = (char *)0x0;
    pcStackY_b28 = (code *)0x1533bc;
    iov = uVar15;
    iVar3 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)auStack_b10,(uv_file)puVar5,&iov,1,0,
                       (uv_fs_cb)0x0);
    if (iVar3 < 0) goto LAB_001534be;
    if ((long)auStack_b10._88_8_ < 0) goto LAB_001534c3;
    loop = buf;
    pcStackY_b28 = (code *)0x1533e3;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_001534c8;
    pcStackY_b28 = (code *)0x153400;
    uv_fs_close(::loop,(uv_fs_t *)auStack_b10,(uv_file)puVar5,(uv_fs_cb)0x0);
    pcStackY_b28 = (code *)0x15340e;
    uv_run(::loop,UV_RUN_DEFAULT);
    pcStackY_b28 = (code *)0x15341a;
    unlink("test_file");
    pcStackY_b28 = (code *)0x153426;
    unlink("test_file_link");
    pcStackY_b28 = (code *)0x153432;
    unlink("test_file_link2");
    pcStackY_b28 = (code *)0x153437;
    puVar5 = uv_default_loop();
    pcStackY_b28 = (code *)0x15344b;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    pcStackY_b28 = (code *)0x153455;
    uv_run(puVar5,UV_RUN_DEFAULT);
    pcStackY_b28 = (code *)0x15345a;
    loop = (char *)uv_default_loop();
    pcStackY_b28 = (code *)0x153462;
    iVar3 = uv_loop_close((uv_loop_t *)loop);
    if (iVar3 == 0) {
      return;
    }
  }
  pcStackY_b28 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)loop)->backend_fd == 0x17) {
    if (((uv_loop_t *)loop)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      uv_fs_req_cleanup((uv_fs_t *)loop);
      return;
    }
  }
  else {
    puStackY_b30 = (uv_loop_t *)0x1534f1;
    link_cb_cold_1();
  }
  puStackY_b30 = (uv_loop_t *)run_test_fs_readlink;
  link_cb_cold_2();
  puStackY_b30 = puVar5;
  ::loop = uv_default_loop();
  iVar3 = uv_fs_readlink(::loop,&uStackY_ce8,"no_such_file",dummy_cb);
  if (iVar3 == 0) {
    iVar3 = uv_run(::loop,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_001535eb;
    if (dummy_cb_count != 1) goto LAB_001535f0;
    if (uStackY_ce8.ptr != (void *)0x0) goto LAB_001535f5;
    if (uStackY_ce8.result != -2) goto LAB_001535fa;
    uv_fs_req_cleanup(&uStackY_ce8);
    iVar3 = uv_fs_readlink((uv_loop_t *)0x0,&uStackY_ce8,"no_such_file",(uv_fs_cb)0x0);
    if (iVar3 != -2) goto LAB_001535ff;
    if (uStackY_ce8.ptr != (void *)0x0) goto LAB_00153604;
    if (uStackY_ce8.result == -2) {
      uv_fs_req_cleanup(&uStackY_ce8);
      puVar5 = uv_default_loop();
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      iVar3 = uv_loop_close(puVar5);
      if (iVar3 == 0) {
        return;
      }
      goto LAB_0015360e;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_001535eb:
    run_test_fs_readlink_cold_2();
LAB_001535f0:
    run_test_fs_readlink_cold_3();
LAB_001535f5:
    run_test_fs_readlink_cold_4();
LAB_001535fa:
    run_test_fs_readlink_cold_5();
LAB_001535ff:
    run_test_fs_readlink_cold_6();
LAB_00153604:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_0015360e:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return;
}

Assistant:

static void fstat_cb(uv_fs_t* req) {
  uv_stat_t* s = req->ptr;
  ASSERT(req->fs_type == UV_FS_FSTAT);
  ASSERT(req->result == 0);
  ASSERT(s->st_size == sizeof(test_buf));
  uv_fs_req_cleanup(req);
  fstat_cb_count++;
}